

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  Type TVar1;
  uint32 uVar2;
  int iVar3;
  EnumValueDescriptor *pEVar4;
  int *piVar5;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  TVar1 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    iVar3 = *(int *)(field + 0x38);
    pEVar4 = FieldDescriptor::default_value_enum(field);
    iVar3 = ExtensionSet::GetEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),iVar3,
                       *(int *)(pEVar4 + 0x10));
    return iVar3;
  }
  piVar5 = GetRaw<int>(this,message,field);
  return *piVar5;
}

Assistant:

int GeneratedMessageReflection::GetEnumValue(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32 value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}